

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCodeMetadata
          (BinaryReaderIR *this,Offset offset,void *data,Address size)

{
  size_t sVar1;
  char *pcVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  _Elt_pointer pEVar6;
  __uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> local_40;
  pointer local_38;
  pointer puStack_30;
  pointer local_28;
  
  local_38 = (pointer)0x0;
  puStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_initialize<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,data,size + (long)data
            );
  local_40._M_t.
  super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
  super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
       (tuple<wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>)
       operator_new(0x68);
  puVar5 = local_28;
  puVar4 = puStack_30;
  puVar3 = local_38;
  sVar1 = (this->current_metadata_name_)._M_len;
  pcVar2 = (this->current_metadata_name_)._M_str;
  local_28 = (pointer)0x0;
  local_38 = (pointer)0x0;
  puStack_30 = (pointer)0x0;
  *(undefined8 *)
   ((long)&(((CodeMetadataExpr *)
            local_40._M_t.
            super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
            .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
           super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str + 4) = 0;
  *(undefined8 *)
   ((long)&(((CodeMetadataExpr *)
            local_40._M_t.
            super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
            .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
           super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.offset + 4) = 0;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_len = 0;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.filename._M_str = (char *)0x0;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr.super_intrusive_list_base<wabt::Expr>.next_ =
       (Expr *)0x0;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr.super_intrusive_list_base<wabt::Expr>.prev_ =
       (Expr *)0x0;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr.type_ = CodeMetadata;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CodeMetadataExpr_0023f8c8;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->name)._M_len = sVar1;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->name)._M_str = pcVar2;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar3;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->data).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar5;
  (((CodeMetadataExpr *)
   local_40._M_t.
   super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
   super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl)->
  super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.offset = offset;
  pEVar6 = (this->code_metadata_queue_).entries.
           super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pEVar6 != (this->code_metadata_queue_).entries.
                super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pEVar6 == (this->code_metadata_queue_).entries.
                  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pEVar6 = (this->code_metadata_queue_).entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
    std::
    deque<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>,std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>>>
    ::
    emplace_back<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>>
              ((deque<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>,std::allocator<std::unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>>>>
                *)&pEVar6[-1].func_queue,
               (unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
               &local_40);
    if ((_Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>)
        local_40._M_t.
        super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
        .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl !=
        (CodeMetadataExpr *)0x0) {
      (**(code **)(*(long *)local_40._M_t.
                            super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
                            .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl + 8
                  ))();
    }
    local_40._M_t.
    super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>.
    super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl =
         (tuple<wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>)
         (_Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>)
         0x0;
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
    return (Result)Ok;
  }
  __assert_fail("!entries.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x3c,
                "void wabt::(anonymous namespace)::CodeMetadataExprQueue::push_metadata(std::unique_ptr<CodeMetadataExpr>)"
               );
}

Assistant:

Result BinaryReaderIR::OnCodeMetadata(Offset offset,
                                      const void* data,
                                      Address size) {
  std::vector<uint8_t> data_(static_cast<const uint8_t*>(data),
                             static_cast<const uint8_t*>(data) + size);
  auto meta = std::make_unique<CodeMetadataExpr>(current_metadata_name_,
                                                 std::move(data_));
  meta->loc.offset = offset;
  code_metadata_queue_.push_metadata(std::move(meta));
  return Result::Ok;
}